

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall
Graph<Node>::printShortestPath(Graph<Node> *this,ofstream *fout,int *node1,int *node2)

{
  uint uVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  char local_29;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"Shortest path between ",0x16);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)fout,*node1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and ",5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*node2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n\n",3);
  uVar3 = *node1;
  uVar4 = (ulong)(int)uVar3;
  if ((this->minDist).vect[uVar4].vect[*node2] == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"DOES NOT EXIST",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\n------------------------\n\n",0x1b);
    return;
  }
  if (uVar3 != *node2) {
    do {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)fout,(int)uVar4);
      local_29 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
      uVar3 = *node2;
      uVar1 = (this->nextNodeInPath).vect[(int)uVar4].vect[(int)uVar3];
      uVar4 = (ulong)uVar1;
    } while (uVar1 != uVar3);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)fout,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n------------------------\n\n",0x1b);
  return;
}

Assistant:

void printShortestPath(std::ofstream &fout, const int &node1, const int &node2) {
        fout << "Shortest path between " << node1 << " and " << node2 << ":\n\n";
        if (minDist[node1][node2] == -1) {
            fout << "DOES NOT EXIST";
            fout << "\n------------------------\n\n";
            return;
        }

        int currNode = node1;
        while (currNode != node2) {
            fout << currNode << ' ';
            currNode = nextNodeInPath[currNode][node2];
        }

        fout << node2 << "\n------------------------\n\n";
    }